

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system.cxx
# Opt level: O1

bool __thiscall xray_re::xr_file_system::folder_exist(xr_file_system *this,char *path,char *name)

{
  pointer pcVar1;
  bool bVar2;
  path_alias *ppVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_48 [2];
  long local_38 [2];
  
  ppVar3 = find_path_alias(this,path);
  if (ppVar3 == (path_alias *)0x0) {
    bVar2 = false;
  }
  else {
    local_48[0] = local_38;
    pcVar1 = (ppVar3->root)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar1,pcVar1 + (ppVar3->root)._M_string_length);
    std::__cxx11::string::append((char *)local_48);
    bVar2 = folder_exist((char *)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  return bVar2;
}

Assistant:

bool xr_file_system::folder_exist(const char* path, const char* name) const
{
	const path_alias* pa = find_path_alias(path);
	return pa ? folder_exist(pa->root + name) : false;
}